

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib504.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  char *pcVar9;
  timeval tVar10;
  int running;
  int numleft;
  fd_set wr;
  fd_set rd;
  fd_set exc;
  int local_1d8;
  int local_1d4;
  timeval local_1d0;
  int local_1bc;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  tv_test_start = tutil_tvnow();
  iVar1 = curl_global_init(3);
  uVar8 = _stderr;
  if (iVar1 != 0) {
    uVar2 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar8,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib504.c"
                  ,0x2f,iVar1,uVar2);
    goto LAB_00101444;
  }
  lVar3 = curl_easy_init();
  if (lVar3 == 0) {
    lVar4 = 0;
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib504.c"
                  ,0x31);
    iVar1 = 0x7c;
  }
  else {
    if (libtest_arg2 == (char *)0x0) {
LAB_00101361:
      iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
      uVar8 = _stderr;
      if (iVar1 == 0) {
        iVar1 = curl_easy_setopt(lVar3,0x29,1);
        uVar8 = _stderr;
        if (iVar1 == 0) {
          lVar4 = curl_multi_init();
          if (lVar4 == 0) {
            lVar4 = 0;
            curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib504.c"
                          ,0x3a);
            iVar1 = 0x7b;
            goto LAB_00101424;
          }
          iVar1 = curl_multi_add_handle(lVar4,lVar3);
          uVar8 = _stderr;
          if (iVar1 == 0) {
            local_1d8 = -99;
            local_1d0.tv_sec = 1;
            local_1d0.tv_usec = 0;
            curl_mfprintf(_stderr,"curl_multi_perform()\n");
            iVar1 = curl_multi_perform(lVar4,&local_1d4);
            if (iVar1 == 0) {
              do {
                if (local_1d4 < 0) {
                  pcVar9 = 
                  "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                  ;
                  uVar8 = 0x47;
LAB_001017d3:
                  curl_mfprintf(_stderr,pcVar9,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib504.c"
                                ,uVar8);
                  iVar1 = 0x7a;
                  goto LAB_00101424;
                }
                tVar10 = tutil_tvnow();
                lVar5 = tutil_tvdiff(tVar10,tv_test_start);
                if (60000 < lVar5) {
                  uVar8 = 0x49;
LAB_00101838:
                  curl_mfprintf(_stderr,
                                "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib504.c"
                                ,uVar8);
                  iVar1 = 0x7d;
                  goto LAB_00101424;
                }
                if (local_1d4 == 0) {
                  lVar5 = curl_multi_info_read(lVar4,&local_1bc);
                  curl_mfprintf(_stderr,"Expected: not running\n");
                  iVar1 = 0x78 - (uint)(local_1bc != 0 || lVar5 == 0);
                  goto LAB_00101424;
                }
                curl_mfprintf(_stderr,"running == %d\n");
                local_138.__fds_bits[0] = 0;
                local_138.__fds_bits[1] = 0;
                local_138.__fds_bits[2] = 0;
                local_138.__fds_bits[3] = 0;
                local_138.__fds_bits[4] = 0;
                local_138.__fds_bits[5] = 0;
                local_138.__fds_bits[6] = 0;
                local_138.__fds_bits[7] = 0;
                local_138.__fds_bits[8] = 0;
                local_138.__fds_bits[9] = 0;
                local_138.__fds_bits[10] = 0;
                local_138.__fds_bits[0xb] = 0;
                local_138.__fds_bits[0xc] = 0;
                local_138.__fds_bits[0xd] = 0;
                local_138.__fds_bits[0xe] = 0;
                local_138.__fds_bits[0xf] = 0;
                local_1b8.__fds_bits[0] = 0;
                local_1b8.__fds_bits[1] = 0;
                local_1b8.__fds_bits[2] = 0;
                local_1b8.__fds_bits[3] = 0;
                local_1b8.__fds_bits[4] = 0;
                local_1b8.__fds_bits[5] = 0;
                local_1b8.__fds_bits[6] = 0;
                local_1b8.__fds_bits[7] = 0;
                local_1b8.__fds_bits[8] = 0;
                local_1b8.__fds_bits[9] = 0;
                local_1b8.__fds_bits[10] = 0;
                local_1b8.__fds_bits[0xb] = 0;
                local_1b8.__fds_bits[0xc] = 0;
                local_1b8.__fds_bits[0xd] = 0;
                local_1b8.__fds_bits[0xe] = 0;
                local_1b8.__fds_bits[0xf] = 0;
                local_b8.__fds_bits[0] = 0;
                local_b8.__fds_bits[1] = 0;
                local_b8.__fds_bits[2] = 0;
                local_b8.__fds_bits[3] = 0;
                local_b8.__fds_bits[4] = 0;
                local_b8.__fds_bits[5] = 0;
                local_b8.__fds_bits[6] = 0;
                local_b8.__fds_bits[7] = 0;
                local_b8.__fds_bits[8] = 0;
                local_b8.__fds_bits[9] = 0;
                local_b8.__fds_bits[10] = 0;
                local_b8.__fds_bits[0xb] = 0;
                local_b8.__fds_bits[0xc] = 0;
                local_b8.__fds_bits[0xd] = 0;
                local_b8.__fds_bits[0xe] = 0;
                local_b8.__fds_bits[0xf] = 0;
                curl_mfprintf(_stderr,"curl_multi_fdset()\n");
                iVar1 = curl_multi_fdset(lVar4,&local_138,&local_1b8,&local_b8,&local_1d8);
                uVar8 = _stderr;
                if (iVar1 != 0) {
                  uVar2 = curl_multi_strerror(iVar1);
                  pcVar9 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
                  uVar7 = 0x5e;
                  goto LAB_00101417;
                }
                if (local_1d8 < -1) {
                  pcVar9 = 
                  "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
                  uVar8 = 0x5e;
                  goto LAB_001017d3;
                }
                iVar1 = select_wrapper(local_1d8 + 1,&local_138,&local_1b8,&local_b8,&local_1d0);
                if (iVar1 == -1) {
                  piVar6 = __errno_location();
                  uVar8 = _stderr;
                  iVar1 = *piVar6;
                  pcVar9 = strerror(iVar1);
                  curl_mfprintf(uVar8,"%s:%d select() failed, with errno %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib504.c"
                                ,0x62,iVar1,pcVar9);
                  iVar1 = 0x79;
                  goto LAB_00101424;
                }
                tVar10 = tutil_tvnow();
                lVar5 = tutil_tvdiff(tVar10,tv_test_start);
                if (60000 < lVar5) {
                  uVar8 = 100;
                  goto LAB_00101838;
                }
                local_1d8 = -99;
                local_1d0.tv_sec = 1;
                local_1d0.tv_usec = 0;
                curl_mfprintf(_stderr,"curl_multi_perform()\n");
                iVar1 = curl_multi_perform(lVar4,&local_1d4);
              } while (iVar1 == 0);
            }
            uVar8 = _stderr;
            uVar2 = curl_multi_strerror(iVar1);
            pcVar9 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
            uVar7 = 0x47;
          }
          else {
            uVar2 = curl_multi_strerror(iVar1);
            pcVar9 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
            uVar7 = 0x3c;
          }
        }
        else {
          uVar2 = curl_easy_strerror(iVar1);
          pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
          lVar4 = 0;
          uVar7 = 0x38;
        }
      }
      else {
        uVar2 = curl_easy_strerror(iVar1);
        pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        lVar4 = 0;
        uVar7 = 0x37;
      }
    }
    else {
      iVar1 = curl_easy_setopt(lVar3,0x2714);
      uVar8 = _stderr;
      if (iVar1 == 0) goto LAB_00101361;
      uVar2 = curl_easy_strerror(iVar1);
      pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar4 = 0;
      uVar7 = 0x36;
    }
LAB_00101417:
    curl_mfprintf(uVar8,pcVar9,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib504.c"
                  ,uVar7,iVar1,uVar2);
  }
LAB_00101424:
  curl_multi_remove_handle(lVar4,lVar3);
  curl_multi_cleanup(lVar4);
  curl_easy_cleanup(lVar3);
  curl_global_cleanup();
LAB_00101444:
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *c = NULL;
  int res = 0;
  CURLM *m = NULL;
  fd_set rd, wr, exc;
  int running;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(c);

  /* The point here is that there must not be anything running on the given
     proxy port */
  if(libtest_arg2)
    easy_setopt(c, CURLOPT_PROXY, libtest_arg2);
  easy_setopt(c, CURLOPT_URL, URL);
  easy_setopt(c, CURLOPT_VERBOSE, 1L);

  multi_init(m);

  multi_add_handle(m, c);

  for(;;) {
    struct timeval interval;
    int maxfd = -99;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    fprintf(stderr, "curl_multi_perform()\n");

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running) {
      /* This is where this code is expected to reach */
      int numleft;
      CURLMsg *msg = curl_multi_info_read(m, &numleft);
      fprintf(stderr, "Expected: not running\n");
      if(msg && !numleft)
        res = TEST_ERR_SUCCESS; /* this is where we should be */
      else
        res = TEST_ERR_FAILURE; /* not correct */
      break; /* done */
    }
    fprintf(stderr, "running == %d\n", running);

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    fprintf(stderr, "curl_multi_fdset()\n");

    multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  /* proper cleanup sequence - type PA */

  curl_multi_remove_handle(m, c);
  curl_multi_cleanup(m);
  curl_easy_cleanup(c);
  curl_global_cleanup();

  return res;
}